

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtzone.cpp
# Opt level: O0

void icu_63::parseRRULE(UnicodeString *rrule,int32_t *month,int32_t *dow,int32_t *wim,int32_t *dom,
                       int32_t *domCount,UDate *until,UErrorCode *status)

{
  bool bVar1;
  bool bVar2;
  UBool UVar3;
  int8_t iVar4;
  char16_t cVar5;
  int32_t iVar6;
  UDate UVar7;
  int local_174;
  int iStack_170;
  UBool nextDOM;
  int32_t dom_end;
  int32_t dom_start;
  int32_t dom_idx;
  ConstChar16Ptr local_160;
  int local_158;
  int local_154;
  int32_t wday;
  int32_t n;
  int32_t sign;
  int32_t length;
  ConstChar16Ptr local_140;
  ConstChar16Ptr local_138;
  ConstChar16Ptr local_130;
  ConstChar16Ptr local_128;
  int local_120;
  char local_119;
  int32_t eql;
  UBool nextProp;
  UnicodeString value;
  undefined1 local_c8 [8];
  UnicodeString attr;
  UnicodeString prop;
  int32_t prop_end;
  int32_t prop_start;
  UBool yearly;
  int32_t numDom;
  int32_t *domCount_local;
  int32_t *dom_local;
  int32_t *wim_local;
  int32_t *dow_local;
  int32_t *month_local;
  UnicodeString *rrule_local;
  
  UVar3 = ::U_FAILURE(*status);
  if (UVar3 == '\0') {
    prop_start = 0;
    *month = -1;
    *dow = 0;
    *wim = 0;
    *until = -1.84303902528e+17;
    bVar2 = false;
    prop.fUnion._52_4_ = 0;
    UnicodeString::UnicodeString((UnicodeString *)((long)&attr.fUnion + 0x30));
    UnicodeString::UnicodeString((UnicodeString *)local_c8);
    UnicodeString::UnicodeString((UnicodeString *)&eql);
    local_119 = '\x01';
    do {
      while( true ) {
        while( true ) {
          if (local_119 == '\0') {
            if (bVar2) {
              *domCount = prop_start;
              goto LAB_0024baf3;
            }
            goto LAB_0024bad0;
          }
          iVar6 = UnicodeString::indexOf(rrule,L';',prop.fUnion._52_4_);
          if (iVar6 == -1) {
            UnicodeString::setTo
                      ((UnicodeString *)((long)&attr.fUnion + 0x30),rrule,prop.fUnion._52_4_);
            local_119 = '\0';
          }
          else {
            UnicodeString::setTo
                      ((UnicodeString *)((long)&attr.fUnion + 0x30),rrule,prop.fUnion._52_4_,
                       iVar6 - prop.fUnion._52_4_);
            prop.fUnion._52_4_ = iVar6 + 1;
          }
          local_120 = UnicodeString::indexOf((UnicodeString *)((long)&attr.fUnion + 0x30),L'=');
          if (local_120 == -1) goto LAB_0024bad0;
          UnicodeString::setTo
                    ((UnicodeString *)local_c8,(UnicodeString *)((long)&attr.fUnion + 0x30),0,
                     local_120);
          UnicodeString::setTo
                    ((UnicodeString *)&eql,(UnicodeString *)((long)&attr.fUnion + 0x30),
                     local_120 + 1);
          ConstChar16Ptr::ConstChar16Ptr(&local_128,(char16_t *)ICAL_FREQ);
          iVar4 = UnicodeString::compare((UnicodeString *)local_c8,&local_128,-1);
          ConstChar16Ptr::~ConstChar16Ptr(&local_128);
          if (iVar4 != '\0') break;
          ConstChar16Ptr::ConstChar16Ptr(&local_130,(char16_t *)ICAL_YEARLY);
          iVar4 = UnicodeString::compare((UnicodeString *)&eql,&local_130,-1);
          ConstChar16Ptr::~ConstChar16Ptr(&local_130);
          if (iVar4 != '\0') goto LAB_0024bad0;
          bVar2 = true;
        }
        ConstChar16Ptr::ConstChar16Ptr(&local_138,(char16_t *)ICAL_UNTIL);
        iVar4 = UnicodeString::compare((UnicodeString *)local_c8,&local_138,-1);
        ConstChar16Ptr::~ConstChar16Ptr(&local_138);
        if (iVar4 == '\0') break;
        ConstChar16Ptr::ConstChar16Ptr(&local_140,(char16_t *)ICAL_BYMONTH);
        iVar4 = UnicodeString::compare((UnicodeString *)local_c8,&local_140,-1);
        ConstChar16Ptr::~ConstChar16Ptr(&local_140);
        if (iVar4 == '\0') {
          iVar6 = UnicodeString::length((UnicodeString *)&eql);
          if (2 < iVar6) goto LAB_0024bad0;
          iVar6 = UnicodeString::length((UnicodeString *)&eql);
          iVar6 = parseAsciiDigits((UnicodeString *)&eql,0,iVar6,status);
          *month = iVar6 + -1;
          UVar3 = ::U_FAILURE(*status);
          if (((UVar3 != '\0') || (*month < 0)) || (0xb < *month)) goto LAB_0024bad0;
        }
        else {
          ConstChar16Ptr::ConstChar16Ptr((ConstChar16Ptr *)&sign,(char16_t *)ICAL_BYDAY);
          iVar4 = UnicodeString::compare((UnicodeString *)local_c8,(ConstChar16Ptr *)&sign,-1);
          ConstChar16Ptr::~ConstChar16Ptr((ConstChar16Ptr *)&sign);
          if (iVar4 == '\0') {
            n = UnicodeString::length((UnicodeString *)&eql);
            if ((n < 2) || (4 < n)) goto LAB_0024bad0;
            if (2 < n) {
              wday = 1;
              cVar5 = UnicodeString::charAt((UnicodeString *)&eql,0);
              if (cVar5 == L'+') {
                wday = 1;
              }
              else {
                cVar5 = UnicodeString::charAt((UnicodeString *)&eql,0);
                if (cVar5 == L'-') {
                  wday = -1;
                }
                else if (n == 4) goto LAB_0024bad0;
              }
              local_154 = parseAsciiDigits((UnicodeString *)&eql,n + -3,1,status);
              UVar3 = ::U_FAILURE(*status);
              if (((UVar3 != '\0') || (local_154 == 0)) || (4 < local_154)) goto LAB_0024bad0;
              *wim = local_154 * wday;
              UnicodeString::remove((UnicodeString *)&eql,(char *)0x0);
            }
            for (local_158 = 0; local_158 < 7; local_158 = local_158 + 1) {
              ConstChar16Ptr::ConstChar16Ptr
                        (&local_160,(char16_t *)(ICAL_DOW_NAMES + (long)local_158 * 6));
              iVar4 = UnicodeString::compare((UnicodeString *)&eql,&local_160,2);
              ConstChar16Ptr::~ConstChar16Ptr(&local_160);
              if (iVar4 == '\0') break;
            }
            if (6 < local_158) goto LAB_0024bad0;
            *dow = local_158 + 1;
          }
          else {
            ConstChar16Ptr::ConstChar16Ptr((ConstChar16Ptr *)&dom_start,(char16_t *)ICAL_BYMONTHDAY)
            ;
            iVar4 = UnicodeString::compare
                              ((UnicodeString *)local_c8,(ConstChar16Ptr *)&dom_start,-1);
            ConstChar16Ptr::~ConstChar16Ptr((ConstChar16Ptr *)&dom_start);
            if (iVar4 == '\0') {
              dom_end = 0;
              iStack_170 = 0;
              bVar1 = true;
              while (bVar1) {
                local_174 = UnicodeString::indexOf((UnicodeString *)&eql,L',',iStack_170);
                if (local_174 == -1) {
                  local_174 = UnicodeString::length((UnicodeString *)&eql);
                  bVar1 = false;
                }
                if (*domCount <= dom_end) {
                  *status = U_BUFFER_OVERFLOW_ERROR;
                  goto LAB_0024bad0;
                }
                iVar6 = parseAsciiDigits((UnicodeString *)&eql,iStack_170,local_174 - iStack_170,
                                         status);
                dom[dom_end] = iVar6;
                UVar3 = ::U_FAILURE(*status);
                if (UVar3 != '\0') goto LAB_0024bad0;
                dom_end = dom_end + 1;
                iStack_170 = local_174 + 1;
              }
              prop_start = dom_end;
            }
          }
        }
      }
      UVar7 = parseDateTimeString((UnicodeString *)&eql,0,status);
      *until = UVar7;
      UVar3 = ::U_FAILURE(*status);
    } while (UVar3 == '\0');
LAB_0024bad0:
    UVar3 = ::U_SUCCESS(*status);
    if (UVar3 != '\0') {
      *status = U_INVALID_FORMAT_ERROR;
    }
LAB_0024baf3:
    UnicodeString::~UnicodeString((UnicodeString *)&eql);
    UnicodeString::~UnicodeString((UnicodeString *)local_c8);
    UnicodeString::~UnicodeString((UnicodeString *)((long)&attr.fUnion + 0x30));
  }
  return;
}

Assistant:

static void parseRRULE(const UnicodeString& rrule, int32_t& month, int32_t& dow, int32_t& wim,
                       int32_t* dom, int32_t& domCount, UDate& until, UErrorCode& status) {
    if (U_FAILURE(status)) {
        return;
    }
    int32_t numDom = 0;

    month = -1;
    dow = 0;
    wim = 0;
    until = MIN_MILLIS;

    UBool yearly = FALSE;
    //UBool parseError = FALSE;

    int32_t prop_start = 0;
    int32_t prop_end;
    UnicodeString prop, attr, value;
    UBool nextProp = TRUE;

    while (nextProp) {
        prop_end = rrule.indexOf(SEMICOLON, prop_start);
        if (prop_end == -1) {
            prop.setTo(rrule, prop_start);
            nextProp = FALSE;
        } else {
            prop.setTo(rrule, prop_start, prop_end - prop_start);
            prop_start = prop_end + 1;
        }
        int32_t eql = prop.indexOf(EQUALS_SIGN);
        if (eql != -1) {
            attr.setTo(prop, 0, eql);
            value.setTo(prop, eql + 1);
        } else {
            goto rruleParseError;
        }

        if (attr.compare(ICAL_FREQ, -1) == 0) {
            // only support YEARLY frequency type
            if (value.compare(ICAL_YEARLY, -1) == 0) {
                yearly = TRUE;
            } else {
                goto rruleParseError;
            }
        } else if (attr.compare(ICAL_UNTIL, -1) == 0) {
            // ISO8601 UTC format, for example, "20060315T020000Z"
            until = parseDateTimeString(value, 0, status);
            if (U_FAILURE(status)) {
                goto rruleParseError;
            }
        } else if (attr.compare(ICAL_BYMONTH, -1) == 0) {
            // Note: BYMONTH may contain multiple months, but only single month make sense for
            // VTIMEZONE property.
            if (value.length() > 2) {
                goto rruleParseError;
            }
            month = parseAsciiDigits(value, 0, value.length(), status) - 1;
            if (U_FAILURE(status) || month < 0 || month >= 12) {
                goto rruleParseError;
            }
        } else if (attr.compare(ICAL_BYDAY, -1) == 0) {
            // Note: BYDAY may contain multiple day of week separated by comma.  It is unlikely used for
            // VTIMEZONE property.  We do not support the case.

            // 2-letter format is used just for representing a day of week, for example, "SU" for Sunday
            // 3 or 4-letter format is used for represeinging Nth day of week, for example, "-1SA" for last Saturday
            int32_t length = value.length();
            if (length < 2 || length > 4) {
                goto rruleParseError;
            }
            if (length > 2) {
                // Nth day of week
                int32_t sign = 1;
                if (value.charAt(0) == PLUS) {
                    sign = 1;
                } else if (value.charAt(0) == MINUS) {
                    sign = -1;
                } else if (length == 4) {
                    goto rruleParseError;
                }
                int32_t n = parseAsciiDigits(value, length - 3, 1, status);
                if (U_FAILURE(status) || n == 0 || n > 4) {
                    goto rruleParseError;
                }
                wim = n * sign;
                value.remove(0, length - 2);
            }
            int32_t wday;
            for (wday = 0; wday < 7; wday++) {
                if (value.compare(ICAL_DOW_NAMES[wday], 2) == 0) {
                    break;
                }
            }
            if (wday < 7) {
                // Sunday(1) - Saturday(7)
                dow = wday + 1;
            } else {
                goto rruleParseError;
            }
        } else if (attr.compare(ICAL_BYMONTHDAY, -1) == 0) {
            // Note: BYMONTHDAY may contain multiple days delimitted by comma
            //
            // A value of BYMONTHDAY could be negative, for example, -1 means
            // the last day in a month
            int32_t dom_idx = 0;
            int32_t dom_start = 0;
            int32_t dom_end;
            UBool nextDOM = TRUE;
            while (nextDOM) {
                dom_end = value.indexOf(COMMA, dom_start);
                if (dom_end == -1) {
                    dom_end = value.length();
                    nextDOM = FALSE;
                }
                if (dom_idx < domCount) {
                    dom[dom_idx] = parseAsciiDigits(value, dom_start, dom_end - dom_start, status);
                    if (U_FAILURE(status)) {
                        goto rruleParseError;
                    }
                    dom_idx++;
                } else {
                    status = U_BUFFER_OVERFLOW_ERROR;
                    goto rruleParseError;
                }
                dom_start = dom_end + 1;
            }
            numDom = dom_idx;
        }
    }
    if (!yearly) {
        // FREQ=YEARLY must be set
        goto rruleParseError;
    }
    // Set actual number of parsed DOM (ICAL_BYMONTHDAY)
    domCount = numDom;
    return;

rruleParseError:
    if (U_SUCCESS(status)) {
        // Set error status
        status = U_INVALID_FORMAT_ERROR;
    }
}